

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corr.hpp
# Opt level: O3

void duckdb::CorrOperation::Finalize<double,duckdb::CorrState>
               (CorrState *state,double *target,AggregateFinalizeData *finalize_data)

{
  uint64_t uVar1;
  uint64_t uVar2;
  bool bVar3;
  OutOfRangeException *pOVar4;
  ulong uVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  string local_58;
  double local_38;
  undefined8 uStack_30;
  
  uVar1 = (state->cov_pop).count;
  if (((uVar1 == 0) || (uVar2 = (state->dev_pop_x).count, uVar2 == 0)) ||
     ((state->dev_pop_y).count == 0)) {
    AggregateFinalizeData::ReturnNull(finalize_data);
    return;
  }
  local_38 = (state->cov_pop).co_moment;
  uStack_30 = 0;
  dVar6 = 0.0;
  if (uVar2 != 1) {
    auVar9._8_4_ = (int)(uVar2 >> 0x20);
    auVar9._0_8_ = uVar2;
    auVar9._12_4_ = 0x45300000;
    dVar6 = (state->dev_pop_x).dsquared /
            ((auVar9._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0));
    if (dVar6 < 0.0) {
      dVar6 = sqrt(dVar6);
    }
    else {
      dVar6 = SQRT(dVar6);
    }
  }
  bVar3 = Value::DoubleIsFinite(dVar6);
  if (bVar3) {
    uVar5 = (state->dev_pop_y).count;
    dVar7 = 0.0;
    if (1 < uVar5) {
      auVar10._8_4_ = (int)(uVar5 >> 0x20);
      auVar10._0_8_ = uVar5;
      auVar10._12_4_ = 0x45300000;
      dVar7 = (state->dev_pop_y).dsquared /
              ((auVar10._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)uVar5) - 4503599627370496.0));
      if (dVar7 < 0.0) {
        dVar7 = sqrt(dVar7);
      }
      else {
        dVar7 = SQRT(dVar7);
      }
    }
    bVar3 = Value::DoubleIsFinite(dVar7);
    if (bVar3) {
      auVar8._8_4_ = (int)(uVar1 >> 0x20);
      auVar8._0_8_ = uVar1;
      auVar8._12_4_ = 0x45300000;
      uVar5 = -(ulong)(dVar6 * dVar7 != 0.0);
      *target = (double)(~uVar5 & 0x7ff8000000000000 |
                        (ulong)((local_38 /
                                ((auVar8._8_8_ - 1.9342813113834067e+25) +
                                ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0))) /
                               (dVar6 * dVar7)) & uVar5);
      return;
    }
    pOVar4 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,"STDDEV_POP for Y is out of range!","");
    OutOfRangeException::OutOfRangeException(pOVar4,&local_58);
    __cxa_throw(pOVar4,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
  }
  pOVar4 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"STDDEV_POP for X is out of range!","");
  OutOfRangeException::OutOfRangeException(pOVar4,&local_58);
  __cxa_throw(pOVar4,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static void Finalize(STATE &state, T &target, AggregateFinalizeData &finalize_data) {
		if (state.cov_pop.count == 0 || state.dev_pop_x.count == 0 || state.dev_pop_y.count == 0) {
			finalize_data.ReturnNull();
		} else {
			auto cov = state.cov_pop.co_moment / state.cov_pop.count;
			auto std_x = state.dev_pop_x.count > 1 ? sqrt(state.dev_pop_x.dsquared / state.dev_pop_x.count) : 0;
			if (!Value::DoubleIsFinite(std_x)) {
				throw OutOfRangeException("STDDEV_POP for X is out of range!");
			}
			auto std_y = state.dev_pop_y.count > 1 ? sqrt(state.dev_pop_y.dsquared / state.dev_pop_y.count) : 0;
			if (!Value::DoubleIsFinite(std_y)) {
				throw OutOfRangeException("STDDEV_POP for Y is out of range!");
			}
			target = std_x * std_y != 0 ? cov / (std_x * std_y) : NAN;
		}
	}